

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O3

void __thiscall cmProcess::OnRead(cmProcess *this,ssize_t nread,uv_buf_t *buf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCTest *this_00;
  bool bVar2;
  char *__s;
  size_t sVar3;
  uv_timer_s *handle;
  string line;
  string strdata;
  undefined1 auStack_1e8 [8];
  string local_1e0;
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  paVar1 = &local_1e0.field_2;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  if (nread < 1) {
    if (nread != -0xfff) {
      if (nread == 0) goto LAB_005b3d72;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"Error reading stream: ",0x16);
      __s = uv_strerror((int)nread);
      if (__s == (char *)0x0) {
        std::ios::clear((int)auStack_1e8 + (int)*(undefined8 *)(local_1a0._0_8_ + -0x18) + 0x48);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar3);
      }
      std::ios::widen((char)(ostream *)local_1a0 + (char)*(undefined8 *)(local_1a0._0_8_ + -0x18));
      std::ostream::put((char)local_1a0);
      std::ostream::flush();
      this_00 = ((this->Runner)._M_t.
                 super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
                 super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
                 super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl)->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_00,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmProcess.cxx"
                   ,0xf0,(char *)local_1c0,false);
      if (local_1c0 != local_1b0) {
        operator_delete(local_1c0,local_1b0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
    }
    bVar2 = Buffer::GetLast(&this->Output,&local_1e0);
    if (bVar2) {
      cmCTestRunTest::CheckOutput
                ((this->Runner)._M_t.
                 super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
                 super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
                 super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl,&local_1e0);
    }
    this->ReadHandleClosed = true;
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset((uv_handle_ptr_base_<uv_pipe_s> *)&this->PipeReader)
    ;
    if (this->ProcessHandleClosed == true) {
      handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_timer_s_
                         (&(this->Timer).super_uv_handle_ptr_<uv_timer_s>);
      uv_timer_stop(handle);
      Finish(this);
    }
  }
  else {
    local_1a0._8_8_ = 0;
    local_1a0[0x10] = '\0';
    local_1a0._0_8_ = local_1a0 + 0x10;
    cmProcessOutput::DecodeText(&this->Conv,buf->base,nread,(string *)local_1a0,0);
    std::vector<char,std::allocator<char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((vector<char,std::allocator<char>> *)&this->Output,
               (this->Output).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish,local_1a0._0_8_,(pointer)(local_1a0._0_8_ + local_1a0._8_8_));
    while( true ) {
      bVar2 = Buffer::GetLine(&this->Output,&local_1e0);
      if (!bVar2) break;
      cmCTestRunTest::CheckOutput
                ((this->Runner)._M_t.
                 super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
                 super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
                 super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl,&local_1e0);
      local_1e0._M_string_length = 0;
      *local_1e0._M_dataplus._M_p = '\0';
    }
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_,CONCAT71(local_1a0._17_7_,local_1a0[0x10]) + 1);
    }
  }
LAB_005b3d72:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                             local_1e0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmProcess::OnRead(ssize_t nread, const uv_buf_t* buf)
{
  std::string line;
  if (nread > 0) {
    std::string strdata;
    this->Conv.DecodeText(buf->base, static_cast<size_t>(nread), strdata);
    cm::append(this->Output, strdata);

    while (this->Output.GetLine(line)) {
      this->Runner->CheckOutput(line);
      line.clear();
    }

    return;
  }

  if (nread == 0) {
    return;
  }

  // The process will provide no more data.
  if (nread != UV_EOF) {
    auto error = static_cast<int>(nread);
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Error reading stream: " << uv_strerror(error) << std::endl);
  }

  // Look for partial last lines.
  if (this->Output.GetLast(line)) {
    this->Runner->CheckOutput(line);
  }

  this->ReadHandleClosed = true;
  this->PipeReader.reset();
  if (this->ProcessHandleClosed) {
    uv_timer_stop(this->Timer);
    this->Finish();
  }
}